

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int stdin2mem(int hd)

{
  int iVar1;
  size_t sVar2;
  int in_EDI;
  int jj;
  int ii;
  int c;
  char simple [7];
  char *memptr;
  LONGLONG filesize;
  size_t delta;
  size_t memsize;
  size_t nread;
  int local_44;
  int local_40;
  undefined4 local_37;
  undefined2 local_33;
  undefined1 local_31;
  char *local_30;
  ulong local_28;
  size_t local_20;
  size_t local_18;
  ulong local_10;
  int local_8;
  int local_4;
  
  local_37 = 0x504d4953;
  local_33 = 0x454c;
  local_31 = 0;
  local_30 = *memTable[in_EDI].memaddrptr;
  local_18 = *memTable[in_EDI].memsizeptr;
  local_20 = memTable[in_EDI].deltasize;
  local_28 = 0;
  local_40 = 0;
  local_44 = 0;
  local_8 = in_EDI;
  do {
    iVar1 = fgetc(_stdin);
    if (iVar1 == -1 || 1999 < local_44) {
LAB_0013ae72:
      if (local_28 == 0) {
        ffpmsg((char *)0x13ae86);
        ffpmsg((char *)0x13ae92);
        local_4 = 0x68;
      }
      else {
        sVar2 = fread(local_30 + 6,1,local_18 - 6,_stdin);
        local_28 = sVar2 + 6;
        local_10 = local_28;
        if (local_28 < local_18) {
          memTable[local_8].fitsfilesize = local_28;
          local_4 = 0;
        }
        else {
          do {
            local_30 = (char *)realloc(local_30,local_18 + local_20);
            if (local_30 == (char *)0x0) {
              ffpmsg((char *)0x13af44);
              return 0x71;
            }
            local_18 = local_20 + local_18;
            local_10 = fread(local_30 + local_28,1,local_20,_stdin);
            local_28 = local_10 + local_28;
          } while (local_20 <= local_10);
          memTable[local_8].fitsfilesize = local_28;
          *memTable[local_8].memaddrptr = local_30;
          *memTable[local_8].memsizeptr = local_18;
          local_4 = 0;
        }
      }
      return local_4;
    }
    if (iVar1 == *(char *)((long)&local_37 + (long)local_40)) {
      local_40 = local_40 + 1;
      if (local_40 == 6) {
        *(undefined4 *)local_30 = local_37;
        *(undefined2 *)(local_30 + 4) = local_33;
        local_28 = 6;
        goto LAB_0013ae72;
      }
    }
    else {
      local_40 = 0;
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

int stdin2mem(int hd)  /* handle number */
/*
  Copy the stdin stream into memory.  Fill whatever amount of memory
  has already been allocated, then realloc more memory if necessary.
*/
{
    size_t nread, memsize, delta;
    LONGLONG filesize;
    char *memptr;
    char simple[] = "SIMPLE";
    int c, ii, jj;

    memptr = *memTable[hd].memaddrptr;
    memsize = *memTable[hd].memsizeptr;
    delta = memTable[hd].deltasize;

    filesize = 0;
    ii = 0;

    for(jj = 0; (c = fgetc(stdin)) != EOF && jj < 2000; jj++)
    {
       /* Skip over any garbage at the beginning of the stdin stream by */
       /* reading 1 char at a time, looking for 'S', 'I', 'M', 'P', 'L', 'E' */
       /* Give up if not found in the first 2000 characters */

       if (c == simple[ii])
       {
           ii++;
           if (ii == 6)   /* found the complete string? */
           {
              memcpy(memptr, simple, 6);  /* copy "SIMPLE" to buffer */
              filesize = 6;
              break;
           }
       }
       else
          ii = 0;  /* reset search to beginning of the string */
    }

   if (filesize == 0)
   {
       ffpmsg("Couldn't find the string 'SIMPLE' in the stdin stream.");
       ffpmsg("This does not look like a FITS file.");
       return(FILE_NOT_OPENED);
   }

    /* fill up the remainder of the initial memory allocation */
    nread = fread(memptr + 6, 1, memsize - 6, stdin);
    nread += 6;  /* add in the 6 characters in 'SIMPLE' */

    if (nread < memsize)    /* reached the end? */
    {
       memTable[hd].fitsfilesize = nread;
       return(0);
    }

    filesize = nread;

    while (1)
    {
        /* allocate memory for another FITS block */
        memptr = realloc(memptr, memsize + delta);

        if (!memptr)
        {
            ffpmsg("realloc failed while copying stdin (stdin2mem)");
            return(MEMORY_ALLOCATION);
        }
        memsize += delta;

        /* read another FITS block */
        nread = fread(memptr + filesize, 1, delta, stdin);

        filesize += nread;

        if (nread < delta)    /* reached the end? */
           break;
    }

     memTable[hd].fitsfilesize = filesize;
    *memTable[hd].memaddrptr = memptr;
    *memTable[hd].memsizeptr = memsize;

    return(0);
}